

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateActivationParams(Result *__return_storage_ptr__,ActivationParams *params)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  WeightParamType WVar8;
  char *pcVar9;
  size_t sVar10;
  char cVar11;
  ulong uVar12;
  undefined1 *puVar13;
  char cVar14;
  uint uVar15;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  uVar7 = params->_oneof_case_[0] - 10;
  uVar12 = (ulong)uVar7;
  if (uVar7 < 0x3e) {
    if ((0x10040100c0300421U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_0035af49;
    if (uVar12 == 0xf) {
      puVar13 = (undefined1 *)((params->NonlinearityType_).prelu_)->alpha_;
      if ((WeightParams *)puVar13 == (WeightParams *)0x0) {
        puVar13 = Specification::_WeightParams_default_instance_;
      }
      uVar7 = (uint)(0 < (((WeightParams *)puVar13)->floatvalue_).current_size_);
      uVar5 = uVar7 + 1;
      if (*(long *)(((ulong)(((WeightParams *)puVar13)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8) == 0) {
        uVar5 = uVar7;
      }
      if (((uVar5 - (*(long *)(((ulong)(((WeightParams *)puVar13)->rawvalue_).tagged_ptr_.ptr_ &
                               0xfffffffffffffffe) + 8) == 0)) + 2) -
          (uint)(*(long *)(((ulong)(((WeightParams *)puVar13)->int8rawvalue_).tagged_ptr_.ptr_ &
                           0xfffffffffffffffe) + 8) == 0) < 2) goto LAB_0035af49;
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
      pcVar9 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar9,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198," has inconsistent weight parameter types.",0x29);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
      goto LAB_0035b22d;
    }
    if (uVar12 == 0x3d) {
      puVar13 = (undefined1 *)((params->NonlinearityType_).parametricsoftplus_)->alpha_;
      if ((WeightParams *)puVar13 == (WeightParams *)0x0) {
        puVar13 = Specification::_WeightParams_default_instance_;
      }
      iVar1 = (((WeightParams *)puVar13)->floatvalue_).current_size_;
      lVar2 = *(long *)(((ulong)(((WeightParams *)puVar13)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar7 = (0 < iVar1) + 1;
      if (lVar2 == 0) {
        uVar7 = (uint)(0 < iVar1);
      }
      lVar3 = *(long *)(((ulong)(((WeightParams *)puVar13)->rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      lVar4 = *(long *)(((ulong)(((WeightParams *)puVar13)->int8rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar5 = (uint)(lVar4 == 0);
      uVar7 = (uVar7 - (lVar3 == 0)) + 2;
      cVar11 = '\x04';
      if (uVar7 - uVar5 < 2) {
        cVar11 = '\x05';
        if (uVar7 != uVar5) {
          cVar11 = iVar1 < 1;
        }
        if ((((lVar2 == 0) && (uVar7 != uVar5)) && (iVar1 < 1)) &&
           ((((lVar3 == 0 || (puVar13 == Specification::_WeightParams_default_instance_)) ||
             (cVar11 = '\x02', ((WeightParams *)puVar13)->quantization_ == (QuantizationParams *)0x0
             )) && (((lVar4 == 0 || (puVar13 == Specification::_WeightParams_default_instance_)) ||
                    (cVar11 = '\x03',
                    ((WeightParams *)puVar13)->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar11 = '\x05';
        }
      }
      puVar13 = (undefined1 *)((params->NonlinearityType_).parametricsoftplus_)->beta_;
      if ((WeightParams *)puVar13 == (WeightParams *)0x0) {
        puVar13 = Specification::_WeightParams_default_instance_;
      }
      iVar1 = (((WeightParams *)puVar13)->floatvalue_).current_size_;
      lVar2 = *(long *)(((ulong)(((WeightParams *)puVar13)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar15 = (0 < iVar1) + 1;
      if (lVar2 == 0) {
        uVar15 = (uint)(0 < iVar1);
      }
      lVar3 = *(long *)(((ulong)(((WeightParams *)puVar13)->rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      lVar4 = *(long *)(((ulong)(((WeightParams *)puVar13)->int8rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar6 = (uint)(lVar4 == 0);
      uVar15 = (uVar15 - (lVar3 == 0)) + 2;
      cVar14 = '\x04';
      if (uVar15 - uVar6 < 2) {
        cVar14 = '\x05';
        if (uVar15 != uVar6) {
          cVar14 = iVar1 < 1;
        }
        if ((((lVar2 == 0) && (uVar15 != uVar6)) && (iVar1 < 1)) &&
           ((((lVar3 == 0 || (puVar13 == Specification::_WeightParams_default_instance_)) ||
             (cVar14 = '\x02', ((WeightParams *)puVar13)->quantization_ == (QuantizationParams *)0x0
             )) && (((lVar4 == 0 || (puVar13 == Specification::_WeightParams_default_instance_)) ||
                    (cVar14 = '\x03',
                    ((WeightParams *)puVar13)->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar14 = '\x05';
        }
      }
      if (((1 < uVar7 - uVar5) || (cVar11 != cVar14)) ||
         (WVar8 = valueType((WeightParams *)puVar13), WVar8 == UNSPECIFIED)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
        pcVar9 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
        sVar10 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar9,sVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_198," has inconsistent weight parameter types.",0x29);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
        goto LAB_0035b22d;
      }
      goto LAB_0035af49;
    }
  }
  if (params->_oneof_case_[0] != 5) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
    pcVar9 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar9,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198," is not supported in this version of CoreML.",0x2c);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
LAB_0035b22d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
LAB_0035af49:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for non-recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLeakyReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kELU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftplus:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kPReLU:
        {
            if (valueType(params.prelu().alpha()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus:
        {
            if (valueType(params.parametricsoftplus().alpha()) != valueType(params.parametricsoftplus().beta()) ||
                valueType(params.parametricsoftplus().alpha()) == UNSPECIFIED ||
                valueType(params.parametricsoftplus().beta()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kThresholdedReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftsign:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Nonlinearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}